

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  char *pcVar1;
  filename_t *pfVar2;
  bool bVar3;
  int iVar4;
  int extraout_EAX;
  int *piVar5;
  os local_120 [32];
  char local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  FILE *local_70;
  FILE *tmp;
  os local_58 [36];
  int local_34;
  char *pcStack_30;
  int tries;
  char *trunc_mode;
  char *mode;
  string *psStack_18;
  bool truncate_local;
  filename_t *fname_local;
  file_helper *this_local;
  undefined7 extraout_var;
  
  mode._7_1_ = (byte)__oflag & 1;
  psStack_18 = (string *)__file;
  fname_local = (filename_t *)this;
  close(this,(int)__file);
  std::__cxx11::string::operator=((string *)&this->filename_,psStack_18);
  trunc_mode = "ab";
  pcStack_30 = "wb";
  bVar3 = std::function::operator_cast_to_bool((function *)&this->event_handlers_);
  if (bVar3) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&(this->event_handlers_).before_open,&this->filename_);
  }
  local_34 = 0;
  do {
    if (this->open_tries_ <= local_34) {
      os::filename_to_str(local_120,&this->filename_);
      std::operator+(local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Failed opening file ");
      std::operator+(local_e0,local_100);
      piVar5 = __errno_location();
      throw_spdlog_ex(local_e0,*piVar5);
    }
    os::dir_name(local_58,(filename_t *)psStack_18);
    os::create_dir((filename_t *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    pfVar2 = (filename_t *)psStack_18;
    pcVar1 = pcStack_30;
    if ((mode._7_1_ & 1) == 0) {
LAB_00154fb6:
      pfVar2 = (filename_t *)psStack_18;
      pcVar1 = trunc_mode;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,pcVar1,&local_b9);
      bVar3 = os::fopen_s(&this->fd_,pfVar2,(filename_t *)local_b8);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        bVar3 = std::function::operator_cast_to_bool
                          ((function *)&(this->event_handlers_).after_open);
        iVar4 = (int)CONCAT71(extraout_var,bVar3);
        if (bVar3) {
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
          ::operator()(&(this->event_handlers_).after_open,&this->filename_,this->fd_);
          iVar4 = extraout_EAX;
        }
        return iVar4;
      }
      os::sleep_for_millis(this->open_interval_);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,pcVar1,&local_91);
      bVar3 = os::fopen_s((FILE **)&local_70,pfVar2,(filename_t *)local_90);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      if (!bVar3) {
        fclose(local_70);
        goto LAB_00154fb6;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

SPDLOG_INLINE void file_helper::open(const filename_t &fname, bool truncate) {
    close();
    filename_ = fname;

    auto *mode = SPDLOG_FILENAME_T("ab");
    auto *trunc_mode = SPDLOG_FILENAME_T("wb");

    if (event_handlers_.before_open) {
        event_handlers_.before_open(filename_);
    }
    for (int tries = 0; tries < open_tries_; ++tries) {
        // create containing folder if not exists already.
        os::create_dir(os::dir_name(fname));
        if (truncate) {
            // Truncate by opening-and-closing a tmp file in "wb" mode, always
            // opening the actual log-we-write-to in "ab" mode, since that
            // interacts more politely with eternal processes that might
            // rotate/truncate the file underneath us.
            std::FILE *tmp;
            if (os::fopen_s(&tmp, fname, trunc_mode)) {
                continue;
            }
            std::fclose(tmp);
        }
        if (!os::fopen_s(&fd_, fname, mode)) {
            if (event_handlers_.after_open) {
                event_handlers_.after_open(filename_, fd_);
            }
            return;
        }

        details::os::sleep_for_millis(open_interval_);
    }

    throw_spdlog_ex("Failed opening file " + os::filename_to_str(filename_) + " for writing",
                    errno);
}